

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

int xmlXIncludeLoadTxt(xmlXIncludeCtxtPtr ctxt,xmlXIncludeRefPtr ref)

{
  xmlParserInputBufferPtr in;
  uint uVar1;
  int iVar2;
  xmlParserErrors error;
  uint uVar3;
  xmlChar *extra;
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr input;
  xmlNodePtr cur;
  size_t sVar4;
  xmlXIncludeTxt *pxVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int l;
  xmlCharEncodingHandlerPtr handler;
  int local_4c;
  xmlChar *local_48;
  xmlCharEncodingHandler *local_40;
  xmlChar *local_38;
  
  pxVar7 = ref->URI;
  local_40 = (xmlCharEncodingHandlerPtr)0x0;
  if (*pxVar7 == '\0') {
    input = (xmlParserInputPtr)0x0;
    xmlXIncludeErr(ctxt,ref->elem,0x647,"text serialization of document not available\n",
                   (xmlChar *)0x0);
    iVar2 = -1;
    ctxt_00 = (xmlParserCtxtPtr)0x0;
    extra = (xmlChar *)0x0;
    goto LAB_001b7aef;
  }
  if (0 < ctxt->txtNr) {
    lVar10 = 0;
    lVar12 = 0;
    do {
      iVar2 = xmlStrEqual(pxVar7,*(xmlChar **)((long)&ctxt->txtTab->url + lVar10));
      if (iVar2 != 0) {
        cur = xmlNewDocText(ctxt->doc,*(xmlChar **)((long)&ctxt->txtTab->text + lVar10));
        if (cur == (xmlNodePtr)0x0) {
          ctxt->fatalErr = 1;
          ctxt->errNo = 2;
          ctxt->nbErrors = ctxt->nbErrors + 1;
          input = (xmlParserInputPtr)0x0;
          xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                              (xmlError *)0x0);
          ctxt_00 = (xmlParserCtxtPtr)0x0;
          extra = (xmlChar *)0x0;
          cur = (xmlNodePtr)0x0;
        }
        else {
          input = (xmlParserInputPtr)0x0;
          ctxt_00 = (xmlParserCtxtPtr)0x0;
          extra = (xmlChar *)0x0;
        }
        goto LAB_001b7aa1;
      }
      lVar12 = lVar12 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar12 < ctxt->txtNr);
  }
  if ((ref->elem == (xmlNodePtr)0x0) ||
     (extra = xmlXIncludeGetProp(ctxt,ref->elem,"encoding"), extra == (xmlChar *)0x0)) {
    extra = (xmlChar *)0x0;
LAB_001b77fd:
    ctxt_00 = xmlNewParserCtxt();
    if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
      ctxt->fatalErr = 1;
      ctxt->errNo = 2;
      ctxt->nbErrors = ctxt->nbErrors + 1;
      xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                          (xmlError *)0x0);
      goto LAB_001b7aec;
    }
    if (ctxt->errorHandler != (xmlStructuredErrorFunc)0x0) {
      xmlCtxtSetErrorHandler(ctxt_00,ctxt->errorHandler,ctxt->errorCtxt);
    }
    if (ctxt->resourceLoader != (xmlResourceLoader)0x0) {
      xmlCtxtSetResourceLoader(ctxt_00,ctxt->resourceLoader,ctxt->resourceCtxt);
    }
    input = xmlLoadResource(ctxt_00,(char *)pxVar7,(char *)0x0,XML_RESOURCE_XINCLUDE_TEXT);
    if (input != (xmlParserInputPtr)0x0) {
      in = input->buf;
      if (in == (xmlParserInputBufferPtr)0x0) {
LAB_001b7b61:
        cur = (xmlNodePtr)0x0;
      }
      else {
        if (in->encoder != (xmlCharEncodingHandler *)0x0) {
          xmlCharEncCloseFunc(in->encoder);
        }
        in->encoder = local_40;
        local_40 = (xmlCharEncodingHandlerPtr)0x0;
        cur = xmlNewDocText(ctxt->doc,(xmlChar *)0x0);
        if (cur == (xmlNodePtr)0x0) {
          xmlXIncludeErrMemory(ctxt);
          goto LAB_001b7b61;
        }
        do {
          iVar2 = xmlParserInputBufferRead(in,0x1000);
        } while (0 < iVar2);
        if (iVar2 < 0) {
          if (in->error == 2) {
            xmlXIncludeErrMemory(ctxt);
          }
          else {
            xmlXIncludeErr(ctxt,(xmlNodePtr)0x0,in->error,"read error",(xmlChar *)0x0);
          }
        }
        else {
          local_48 = extra;
          local_38 = xmlBufContent(in->buffer);
          sVar4 = xmlBufUse(in->buffer);
          iVar2 = (int)sVar4;
          if (0 < iVar2) {
            iVar8 = 0;
            do {
              local_4c = iVar2 - iVar8;
              uVar3 = xmlGetUTF8Char(local_38 + iVar8,&local_4c);
              if ((int)uVar3 < 0) {
LAB_001b7b8b:
                xmlXIncludeErr(ctxt,ref->elem,0x648,"%s contains invalid char\n",pxVar7);
                extra = local_48;
                goto LAB_001b7b69;
              }
              if (uVar3 < 0x100) {
                if ((uVar3 < 0x20) && ((0xd < uVar3 || ((0x2600U >> (uVar3 & 0x1f) & 1) == 0))))
                goto LAB_001b7b8b;
              }
              else if (0xfffff < uVar3 - 0x10000 && (0x1ffd < uVar3 - 0xe000 && 0xd7ff < uVar3))
              goto LAB_001b7b8b;
              iVar8 = iVar8 + local_4c;
            } while (iVar8 < iVar2);
          }
          iVar2 = xmlNodeAddContentLen(cur,local_38,iVar2);
          if (iVar2 < 0) {
            xmlXIncludeErrMemory(ctxt);
          }
          uVar3 = ctxt->txtMax;
          if (ctxt->txtNr < (int)uVar3) {
LAB_001b7bf6:
            extra = local_48;
            pxVar6 = xmlStrdup(cur->content);
            ctxt->txtTab[ctxt->txtNr].text = pxVar6;
            if (pxVar6 != (xmlChar *)0x0 || cur->content == (xmlChar *)0x0) {
              pxVar7 = xmlStrdup(pxVar7);
              iVar2 = ctxt->txtNr;
              ctxt->txtTab[iVar2].url = pxVar7;
              if (pxVar7 != (xmlChar *)0x0) {
                ctxt->txtNr = iVar2 + 1;
LAB_001b7aa1:
                ref->inc = cur;
                iVar2 = 0;
                goto LAB_001b7aef;
              }
              xmlXIncludeErrMemory(ctxt);
              (*xmlFree)(ctxt->txtTab[ctxt->txtNr].text);
              goto LAB_001b7b69;
            }
          }
          else {
            if ((int)uVar3 < 1) {
              uVar11 = 8;
LAB_001b7bc9:
              pxVar5 = (xmlXIncludeTxt *)(*xmlRealloc)(ctxt->txtTab,uVar11 << 4);
              if (pxVar5 == (xmlXIncludeTxt *)0x0) {
                xmlXIncludeErrMemory(ctxt);
                extra = local_48;
                goto LAB_001b7b69;
              }
              ctxt->txtMax = (int)uVar11;
              ctxt->txtTab = pxVar5;
              goto LAB_001b7bf6;
            }
            extra = local_48;
            if (uVar3 < 1000000000) {
              uVar9 = uVar3 + 1 >> 1;
              uVar1 = uVar9 + uVar3;
              if (1000000000 - uVar9 < uVar3) {
                uVar1 = 1000000000;
              }
              uVar11 = (ulong)uVar1;
              goto LAB_001b7bc9;
            }
          }
          xmlXIncludeErrMemory(ctxt);
        }
      }
LAB_001b7b69:
      iVar2 = -1;
      goto LAB_001b7af2;
    }
    iVar8 = ctxt_00->errNo;
    iVar2 = -1;
    input = (xmlParserInputPtr)0x0;
    if (iVar8 < 0x5dc) {
      input = (xmlParserInputPtr)0x0;
      if (iVar8 != 0) {
        if (iVar8 != 2) goto LAB_001b7b41;
        xmlXIncludeErrMemory(ctxt);
        input = (xmlParserInputPtr)0x0;
      }
    }
    else if ((iVar8 != 0x5dc) && (iVar8 != 0x5f4)) {
LAB_001b7b41:
      input = (xmlParserInputPtr)0x0;
      xmlXIncludeErr(ctxt,(xmlNodePtr)0x0,iVar8,"load error",(xmlChar *)0x0);
    }
  }
  else {
    error = xmlOpenCharEncodingHandler((char *)extra,0,&local_40);
    if (error == XML_ERR_OK) goto LAB_001b77fd;
    if (error == XML_ERR_UNSUPPORTED_ENCODING) {
      xmlXIncludeErr(ctxt,ref->elem,0x64a,"encoding %s not supported\n",extra);
    }
    else {
      if (error == XML_ERR_NO_MEMORY) {
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
        goto LAB_001b77fd;
      }
      xmlXIncludeErr(ctxt,ref->elem,error,"unexpected error from iconv or ICU\n",(xmlChar *)0x0);
    }
LAB_001b7aec:
    input = (xmlParserInputPtr)0x0;
    iVar2 = -1;
    ctxt_00 = (xmlParserCtxtPtr)0x0;
  }
LAB_001b7aef:
  cur = (xmlNodePtr)0x0;
LAB_001b7af2:
  xmlFreeNode(cur);
  xmlFreeInputStream(input);
  xmlFreeParserCtxt(ctxt_00);
  xmlCharEncCloseFunc(local_40);
  (*xmlFree)(extra);
  return iVar2;
}

Assistant:

static int
xmlXIncludeLoadTxt(xmlXIncludeCtxtPtr ctxt, xmlXIncludeRefPtr ref) {
    xmlParserInputBufferPtr buf;
    xmlNodePtr node = NULL;
    const xmlChar *url = ref->URI;
    int i;
    int ret = -1;
    xmlChar *encoding = NULL;
    xmlCharEncodingHandlerPtr handler = NULL;
    xmlParserCtxtPtr pctxt = NULL;
    xmlParserInputPtr inputStream = NULL;
    int len;
    int res;
    const xmlChar *content;

    /*
     * Handling of references to the local document are done
     * directly through ctxt->doc.
     */
    if (url[0] == 0) {
	xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_TEXT_DOCUMENT,
		       "text serialization of document not available\n", NULL);
	goto error;
    }

    /*
     * Prevent reloading the document twice.
     */
    for (i = 0; i < ctxt->txtNr; i++) {
	if (xmlStrEqual(url, ctxt->txtTab[i].url)) {
            node = xmlNewDocText(ctxt->doc, ctxt->txtTab[i].text);
            if (node == NULL)
                xmlXIncludeErrMemory(ctxt);
	    goto loaded;
	}
    }

    /*
     * Try to get the encoding if available
     */
    if (ref->elem != NULL) {
	encoding = xmlXIncludeGetProp(ctxt, ref->elem, XINCLUDE_PARSE_ENCODING);
    }
    if (encoding != NULL) {
        xmlParserErrors code;

        code = xmlOpenCharEncodingHandler((const char *) encoding,
                                          /* output */ 0, &handler);

        if (code != XML_ERR_OK) {
            if (code == XML_ERR_NO_MEMORY) {
                xmlXIncludeErrMemory(ctxt);
            } else if (code == XML_ERR_UNSUPPORTED_ENCODING) {
                xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_UNKNOWN_ENCODING,
                               "encoding %s not supported\n", encoding);
                goto error;
            } else {
                xmlXIncludeErr(ctxt, ref->elem, code,
                               "unexpected error from iconv or ICU\n", NULL);
                goto error;
            }
        }
    }

    /*
     * Load it.
     */
    pctxt = xmlNewParserCtxt();
    if (pctxt == NULL) {
        xmlXIncludeErrMemory(ctxt);
        goto error;
    }
    if (ctxt->errorHandler != NULL)
        xmlCtxtSetErrorHandler(pctxt, ctxt->errorHandler, ctxt->errorCtxt);
    if (ctxt->resourceLoader != NULL)
        xmlCtxtSetResourceLoader(pctxt, ctxt->resourceLoader,
                                 ctxt->resourceCtxt);

    inputStream = xmlLoadResource(pctxt, (const char*) url, NULL,
                                  XML_RESOURCE_XINCLUDE_TEXT);
    if (inputStream == NULL) {
        /*
         * ENOENT only produces a warning which isn't reflected in errNo.
         */
        if (pctxt->errNo == XML_ERR_NO_MEMORY)
            xmlXIncludeErrMemory(ctxt);
        else if ((pctxt->errNo != XML_ERR_OK) &&
                 (pctxt->errNo != XML_IO_ENOENT) &&
                 (pctxt->errNo != XML_IO_UNKNOWN))
            xmlXIncludeErr(ctxt, NULL, pctxt->errNo, "load error", NULL);
	goto error;
    }
    buf = inputStream->buf;
    if (buf == NULL)
	goto error;
    if (buf->encoder)
	xmlCharEncCloseFunc(buf->encoder);
    buf->encoder = handler;
    handler = NULL;

    node = xmlNewDocText(ctxt->doc, NULL);
    if (node == NULL) {
        xmlXIncludeErrMemory(ctxt);
	goto error;
    }

    /*
     * Scan all chars from the resource and add the to the node
     */
    do {
        res = xmlParserInputBufferRead(buf, 4096);
    } while (res > 0);
    if (res < 0) {
        if (buf->error == XML_ERR_NO_MEMORY)
            xmlXIncludeErrMemory(ctxt);
        else
            xmlXIncludeErr(ctxt, NULL, buf->error, "read error", NULL);
        goto error;
    }

    content = xmlBufContent(buf->buffer);
    len = xmlBufUse(buf->buffer);
    for (i = 0; i < len;) {
        int cur;
        int l;

        l = len - i;
        cur = xmlGetUTF8Char(&content[i], &l);
        if ((cur < 0) || (!IS_CHAR(cur))) {
            xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_INVALID_CHAR,
                           "%s contains invalid char\n", url);
            goto error;
        }

        i += l;
    }

    if (xmlNodeAddContentLen(node, content, len) < 0)
        xmlXIncludeErrMemory(ctxt);

    if (ctxt->txtNr >= ctxt->txtMax) {
        xmlXIncludeTxt *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->txtMax, sizeof(tmp[0]),
                                  8, XML_MAX_ITEMS);
        if (newSize < 0) {
            xmlXIncludeErrMemory(ctxt);
	    goto error;
        }
        tmp = xmlRealloc(ctxt->txtTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlXIncludeErrMemory(ctxt);
	    goto error;
        }
        ctxt->txtMax = newSize;
        ctxt->txtTab = tmp;
    }
    ctxt->txtTab[ctxt->txtNr].text = xmlStrdup(node->content);
    if ((node->content != NULL) &&
        (ctxt->txtTab[ctxt->txtNr].text == NULL)) {
        xmlXIncludeErrMemory(ctxt);
        goto error;
    }
    ctxt->txtTab[ctxt->txtNr].url = xmlStrdup(url);
    if (ctxt->txtTab[ctxt->txtNr].url == NULL) {
        xmlXIncludeErrMemory(ctxt);
        xmlFree(ctxt->txtTab[ctxt->txtNr].text);
        goto error;
    }
    ctxt->txtNr++;

loaded:
    /*
     * Add the element as the replacement copy.
     */
    ref->inc = node;
    node = NULL;
    ret = 0;

error:
    xmlFreeNode(node);
    xmlFreeInputStream(inputStream);
    xmlFreeParserCtxt(pctxt);
    xmlCharEncCloseFunc(handler);
    xmlFree(encoding);
    return(ret);
}